

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O3

bool GetFileTime(MGT_DIR *p,tm *ptm_)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  tm *ptVar4;
  time_t tVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  bool bVar9;
  time_t ttNow;
  time_t local_10;
  
  *(undefined8 *)&ptm_->tm_isdst = 0;
  ptm_->tm_gmtoff = 0;
  ptm_->tm_mon = 0;
  ptm_->tm_year = 0;
  ptm_->tm_wday = 0;
  ptm_->tm_yday = 0;
  ptm_->tm_sec = 0;
  ptm_->tm_min = 0;
  ptm_->tm_hour = 0;
  ptm_->tm_mday = 0;
  ptm_->tm_zone = (char *)0x0;
  bVar1 = p->bMonth;
  bVar6 = p->bMinute;
  if ((char)bVar1 < '\0') {
    ptm_->tm_sec = (uint)bVar6 + (uint)bVar6 & 0x3e;
    bVar6 = p->bHour & 7 | bVar6 >> 2 & 0x38;
    bVar7 = p->bHour >> 3;
    uVar3 = bVar1 >> 3 & 0xe;
  }
  else {
    bVar7 = p->bHour;
    uVar3 = bVar1 - 1;
  }
  bVar1 = p->bYear;
  bVar2 = p->bDay;
  ptm_->tm_min = (uint)bVar6;
  ptm_->tm_hour = (uint)bVar7;
  ptm_->tm_mday = (uint)bVar2;
  uVar8 = bVar1 + 100;
  if (0x4f < bVar1) {
    uVar8 = (uint)bVar1;
  }
  ptm_->tm_mon = uVar3;
  ptm_->tm_year = uVar8;
  if (GetFileTime::nYear == 0) {
    local_10 = time((time_t *)0x0);
    ptVar4 = localtime(&local_10);
    GetFileTime::nYear = ptVar4->tm_year + 0x76c;
    uVar8 = ptm_->tm_year;
  }
  if ((((GetFileTime::nYear < (int)(uVar8 + 0x76c)) || (0xb < (uint)ptm_->tm_mon)) ||
      (0x1f < ptm_->tm_mday || ptm_->tm_mday == 0)) ||
     (((0x17 < ptm_->tm_hour || (0x3c < ptm_->tm_min)) || (0x3c < ptm_->tm_sec)))) {
    bVar9 = false;
  }
  else {
    ptm_->tm_isdst = -1;
    tVar5 = mktime((tm *)ptm_);
    bVar9 = tVar5 != -1;
  }
  return bVar9;
}

Assistant:

bool GetFileTime(const MGT_DIR* p, struct tm* ptm_)
{
    memset(ptm_, 0, sizeof(*ptm_));

    // Check for a packed BDOS 1.4+ date
    if (p->bMonth & 0x80)
    {
        ptm_->tm_sec = (p->bMinute & 0x1f) << 1;
        ptm_->tm_min = ((p->bMinute & 0xe0) >> 2) | (p->bHour & 0x07);
        ptm_->tm_hour = (p->bHour & 0xf8) >> 3;
        //      ptm_->tm_wday =   p->bMonth & 0x07;         // mktime does this for us
        ptm_->tm_mday = p->bDay;
        ptm_->tm_mon = (p->bMonth & 0x71) >> 3;
        ptm_->tm_year = p->bYear;
    }

    // Normal format
    else
    {
        ptm_->tm_min = p->bMinute;
        ptm_->tm_hour = p->bHour;
        ptm_->tm_mday = p->bDay;
        ptm_->tm_mon = p->bMonth - 1;
        ptm_->tm_year = p->bYear;
    }

    // Base smaller year values from 2000 (BDOS considers <80 to be invalid)
    if (ptm_->tm_year < 80)
        ptm_->tm_year += 100;

    // Fetch the current year, if not already cached
    static int nYear = 0;
    if (!nYear)
    {
        time_t ttNow = time(nullptr);
        struct tm* tmNow = localtime(&ttNow);
        nYear = 1900 + tmNow->tm_year;
    }

    // Reject obviously invalid date components
    if (1900 + ptm_->tm_year > nYear ||
        ptm_->tm_mon < 0 || ptm_->tm_mon >= 12 ||
        ptm_->tm_mday == 0 || ptm_->tm_mday >  31 ||
        ptm_->tm_hour > 23 || ptm_->tm_min > 60 || ptm_->tm_sec > 60)
        return false;

    // All dates are taken to be in the local timezone, not UCT/GMT
    ptm_->tm_isdst = -1;

    // Validate the date components
    return mktime(ptm_) != -1;
}